

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O3

level_enum spdlog::level::from_str(string *name)

{
  pointer __s2;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  ulong __n;
  level_enum lVar4;
  long lVar5;
  
  __s2 = (name->_M_dataplus)._M_p;
  uVar1 = name->_M_string_length;
  lVar4 = trace;
  lVar5 = 8;
  do {
    uVar2 = *(ulong *)((long)&level_string_views + lVar5);
    __n = uVar1;
    if (uVar2 < uVar1) {
      __n = uVar2;
    }
    if (__n == 0) {
      if (uVar2 == uVar1) {
        return lVar4;
      }
    }
    else {
      iVar3 = bcmp(*(void **)(lVar5 + 0x1b7678),__s2,__n);
      if ((uVar2 == uVar1) && (iVar3 == 0)) {
        return lVar4;
      }
    }
    lVar4 = lVar4 + debug;
    lVar5 = lVar5 + 0x10;
    if (lVar5 == 0x78) {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        lVar4 = warn;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        lVar4 = (uint)(iVar3 != 0) * 2 + err;
      }
      return lVar4;
    }
  } while( true );
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum from_str(const std::string &name) SPDLOG_NOEXCEPT
{
    int level = 0;
    for (const auto &level_str : level_string_views)
    {
        if (level_str == name)
        {
            return static_cast<level::level_enum>(level);
        }
        level++;
    }
    // check also for "warn" and "err" before giving up..
    if (name == "warn")
    {
        return level::warn;
    }
    if (name == "err")
    {
        return level::err;
    }
    return level::off;
}